

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O1

void fy_advance(fy_parser *fyp,int c)

{
  int iVar1;
  int iVar2;
  size_t advance;
  
  advance = 1;
  if ((0x7f < c) && (advance = 2, 0x7ff < c)) {
    advance = (ulong)(0xffff < c) + 3;
  }
  fy_advance_octets(fyp,advance);
  if ((c == 0xd) && (iVar2 = fy_parse_peek_at_offset(fyp,0), iVar2 == 10)) {
    fy_advance_octets(fyp,1);
  }
  else if ((fyp == (fy_parser *)0x0) ||
          (((c != 10 && (c != 0xd)) &&
           (((fyp->current_input != (fy_input *)0x0 && ((fyp->current_input->field_0x74 & 1) != 0))
            || ((1 < c - 0x2028U && (c != 0x85)))))))) {
    iVar2 = fyp->column;
    iVar1 = fyp->tabsize;
    if (c == 9 && iVar1 != 0) {
      iVar2 = (iVar2 + iVar1) - iVar2 % iVar1;
    }
    else {
      iVar2 = iVar2 + 1;
    }
    fyp->column = iVar2;
    fyp->nontab_column = fyp->nontab_column + 1;
    return;
  }
  fyp->column = 0;
  fyp->nontab_column = 0;
  fyp->line = fyp->line + 1;
  return;
}

Assistant:

static inline void fy_advance(struct fy_parser *fyp, int c) {
    bool is_line_break = false;

    /* skip this character */
    fy_advance_octets(fyp, fy_utf8_width(c));

    /* first check for CR/LF */
    if (c == '\r' && fy_parse_peek(fyp) == '\n') {
        fy_advance_octets(fyp, 1);
        is_line_break = true;
    } else if (fyp_is_lb(fyp, c))
        is_line_break = true;

    if (is_line_break) {
        fyp->column = 0;
        fyp->nontab_column = 0;
        fyp->line++;
    } else if (fyp->tabsize && fy_is_tab(c)) {
        fyp->column += (fyp->tabsize - (fyp->column % fyp->tabsize));
        fyp->nontab_column++;
    } else {
        fyp->column++;
        fyp->nontab_column++;
    }
}